

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::createSurfaces(MakeCurrentPerfCase *this)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  int local_48;
  SurfaceType type;
  int surfaceNdx;
  value_type local_2c;
  undefined1 local_28 [8];
  vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  types;
  MakeCurrentPerfCase *this_local;
  
  types.
  super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ::vector((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
            *)local_28);
  if (((this->m_spec).surfaceTypes & SURFACETYPE_WINDOW) != 0) {
    local_2c = SURFACETYPE_WINDOW;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::push_back((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                 *)local_28,&local_2c);
  }
  if (((this->m_spec).surfaceTypes & SURFACETYPE_PIXMAP) != 0) {
    surfaceNdx = 4;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::push_back((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                 *)local_28,(value_type *)&surfaceNdx);
  }
  if (((this->m_spec).surfaceTypes & SURFACETYPE_PBUFFER) != 0) {
    type = SURFACETYPE_PBUFFER;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::push_back((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                 *)local_28,&type);
  }
  for (local_48 = 0; local_48 < (this->m_spec).surfaceCount; local_48 = local_48 + 1) {
    sVar2 = std::
            vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
            ::size((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                    *)local_28);
    pvVar3 = std::
             vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
             ::operator[]((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                           *)local_28,(ulong)(long)local_48 % sVar2);
    vVar1 = *pvVar3;
    if (vVar1 == SURFACETYPE_PBUFFER) {
      createPBuffer(this);
    }
    else if (vVar1 == SURFACETYPE_WINDOW) {
      createWindow(this);
    }
    else if (vVar1 == SURFACETYPE_PIXMAP) {
      createPixmap(this);
    }
  }
  std::
  vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ::~vector((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
             *)local_28);
  return;
}

Assistant:

void MakeCurrentPerfCase::createSurfaces (void)
{
	vector<SurfaceType> types;

	if ((m_spec.surfaceTypes & SURFACETYPE_WINDOW) != 0)
		types.push_back(SURFACETYPE_WINDOW);

	if ((m_spec.surfaceTypes & SURFACETYPE_PIXMAP) != 0)
		types.push_back(SURFACETYPE_PIXMAP);

	if ((m_spec.surfaceTypes & SURFACETYPE_PBUFFER) != 0)
		types.push_back(SURFACETYPE_PBUFFER);

	DE_ASSERT((int)types.size() <= m_spec.surfaceCount);

	// Create surfaces
	for (int surfaceNdx = 0; surfaceNdx < m_spec.surfaceCount; surfaceNdx++)
	{
		SurfaceType type = types[surfaceNdx % types.size()];

		switch (type)
		{
			case SURFACETYPE_PBUFFER:
				createPBuffer();
				break;

			case SURFACETYPE_WINDOW:
				createWindow();
				break;

			case SURFACETYPE_PIXMAP:
				createPixmap();
				break;

			default:
				DE_ASSERT(false);
		};
	}
}